

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_mean(ggml_context *ctx,ggml_tensor *a)

{
  uint uVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  int extraout_EDX;
  ggml_tensor *extraout_RDX;
  ggml_context *ctx_00;
  int local_28;
  undefined8 local_24;
  int local_1c;
  
  if (a->grad == (ggml_tensor *)0x0) {
    local_28 = 1;
    local_24 = *(undefined8 *)(a->ne + 1);
    local_1c = a->ne[3];
    pgVar3 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,a->n_dims,&local_28,(void *)0x0);
    pgVar3->op = GGML_OP_MEAN;
    pgVar3->grad = (ggml_tensor *)0x0;
    pgVar3->src0 = a;
    pgVar3->src1 = (ggml_tensor *)0x0;
    return pgVar3;
  }
  ggml_mean_cold_1();
  pgVar3 = a;
  ctx_00 = ctx;
  if (extraout_RDX->ne[0] % a->ne[0] == 0) {
    uVar1 = extraout_RDX->ne[1];
    pgVar3 = (ggml_tensor *)(ulong)uVar1;
    if ((int)uVar1 % a->ne[1] == 0) {
      uVar2 = extraout_RDX->ne[2];
      ctx_00 = (ggml_context *)(ulong)uVar2;
      if ((int)uVar2 % a->ne[2] == 0) {
        if (extraout_RDX->ne[3] % a->ne[3] == 0) {
          pgVar3 = a->grad;
          if ((a->ne[3] != extraout_RDX->ne[3] ||
              (a->ne[2] != uVar2 || (a->ne[1] != uVar1 || a->ne[0] != extraout_RDX->ne[0]))) ||
              pgVar3 != (ggml_tensor *)0x0) {
            pgVar5 = (ggml_tensor *)0x0;
            pgVar4 = ggml_new_tensor_impl
                               (ctx,a->type,extraout_RDX->n_dims,extraout_RDX->ne,(void *)0x0);
            pgVar4->op = GGML_OP_REPEAT;
            if (pgVar3 != (ggml_tensor *)0x0) {
              pgVar5 = ggml_new_tensor_impl(ctx,pgVar4->type,pgVar4->n_dims,pgVar4->ne,(void *)0x0);
            }
            pgVar4->grad = pgVar5;
            pgVar4->src0 = a;
            pgVar4->src1 = extraout_RDX;
            a = pgVar4;
          }
          return a;
        }
      }
    }
  }
  ggml_repeat_cold_1();
  if (extraout_EDX == 0) {
    pgVar4 = pgVar3->grad;
    pgVar6 = (ggml_tensor *)0x0;
    pgVar5 = ggml_new_tensor_impl(ctx_00,pgVar3->type,pgVar3->n_dims,pgVar3->ne,(void *)0x0);
    pgVar5->op = GGML_OP_ABS;
    if (pgVar4 != (ggml_tensor *)0x0) {
      pgVar6 = ggml_new_tensor_impl(ctx_00,pgVar5->type,pgVar5->n_dims,pgVar5->ne,(void *)0x0);
    }
  }
  else {
    pgVar5 = ggml_new_tensor_impl(ctx_00,pgVar3->type,pgVar3->n_dims,pgVar3->ne,pgVar3->data);
    pgVar5->op = GGML_OP_ABS;
    pgVar6 = (ggml_tensor *)0x0;
  }
  pgVar5->grad = pgVar6;
  pgVar5->src0 = pgVar3;
  pgVar5->src1 = (ggml_tensor *)0x0;
  return pgVar5;
}

Assistant:

struct ggml_tensor * ggml_mean(
        struct ggml_context * ctx,
        struct ggml_tensor * a) {
    bool is_node = false;

    if (a->grad) {
        GGML_ASSERT(false); // TODO: implement
        is_node = true;
    }

    int ne[GGML_MAX_DIMS] = { 1, a->ne[1], a->ne[2], a->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, a->n_dims, ne);

    result->op   = GGML_OP_MEAN;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}